

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O2

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0,_1>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherIncr,
               long otherStride,level3_blocking<double,_double> *blocking)

{
  ulong size_00;
  size_t size_01;
  double dVar1;
  long lVar2;
  LhsScalar *pLVar3;
  long depth;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  long j;
  long lVar20;
  long lVar21;
  long lVar22;
  long i3;
  long lVar23;
  long lVar24;
  double *pdVar25;
  double *pdVar26;
  double local_1b8;
  ptrdiff_t l1;
  ptrdiff_t l3;
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  ptrdiff_t l2;
  double *local_f0;
  double *local_e0;
  double *local_d8;
  long local_d0;
  double *local_b8;
  long local_98;
  double *local_88;
  blas_data_mapper<double,_long,_0,_0,_1> local_60;
  LhsScalar *local_50;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  local_41;
  double *pdStack_40;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  pack_rhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
  local_32;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
  local_31 [7];
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
  gebp_kernel;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
  pack_lhs;
  
  pdVar8 = &local_1b8;
  if (otherIncr != 1) {
    __assert_fail("incr==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/BlasUtil.h"
                  ,0xae,
                  "Eigen::internal::blas_data_mapper<double, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = double, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
                 );
  }
  lVar2 = blocking->m_kc;
  lVar24 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar24 = size;
  }
  pdVar25 = (double *)(lVar24 * lVar2);
  if ((ulong)pdVar25 >> 0x3d != 0) {
    throw_std_bad_alloc();
  }
  pdVar26 = (double *)(lVar2 * otherSize);
  local_50 = blocking->m_blockA;
  size_00 = (long)pdVar25 * 8;
  if (local_50 == (LhsScalar *)0x0) {
    if (size_00 < 0x20001) {
      l3 = (long)&local_1b8 - (size_00 + 0x1e & 0xfffffffffffffff0);
      blockA_stack_memory_destructor.m_size._0_1_ = false;
      pdVar8 = (double *)l3;
      local_50 = (LhsScalar *)l3;
    }
    else {
      local_50 = (LhsScalar *)aligned_malloc(size_00);
      l3 = (ptrdiff_t)(LhsScalar *)0x0;
      if (blocking->m_blockA == (LhsScalar *)0x0) {
        l3 = (ptrdiff_t)local_50;
      }
      blockA_stack_memory_destructor.m_size._0_1_ = true;
    }
  }
  else {
    blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_00;
    l3 = 0;
    pdVar8 = &local_1b8;
  }
  blockA_stack_memory_destructor.m_ptr = pdVar25;
  if ((double *)0x1fffffffffffffff < pdVar26) {
    pdVar8[-1] = 6.7304784296628e-318;
    throw_std_bad_alloc();
  }
  size_01 = (long)pdVar26 * 8;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (size_01 < 0x20001) {
      pdVar8 = (double *)((long)pdVar8 - (size_01 + 0x1e & 0xfffffffffffffff0));
      blockA_stack_memory_destructor._16_8_ = pdVar8;
      local_88 = pdVar8;
    }
    else {
      pdVar8[-1] = 6.73080451298905e-318;
      local_88 = (double *)aligned_malloc(size_01);
      blockA_stack_memory_destructor._16_8_ = (double *)0x0;
      if (blocking->m_blockB == (RhsScalar *)0x0) {
        blockA_stack_memory_destructor._16_8_ = local_88;
      }
    }
  }
  else {
    blockA_stack_memory_destructor._16_8_ = (double *)0x0;
    local_88 = blocking->m_blockB;
  }
  blockB_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_01;
  blockB_stack_memory_destructor.m_ptr = pdVar26;
  pdVar8[-1] = 6.73116024025406e-318;
  manage_caching_sizes
            (GetAction,(ptrdiff_t *)&local_1b8,
             (ptrdiff_t *)&blockB_stack_memory_destructor.m_deallocate,&l1);
  pdVar8[-1] = 1.97626258336499e-323;
  lVar13 = (long)pdVar8[-1];
  if (otherSize < 1) {
    lVar14 = 0;
  }
  else {
    lVar14 = size;
    if (size < otherStride) {
      lVar14 = otherStride;
    }
    lVar14 = (long)((ulong)blockB_stack_memory_destructor._16_8_ / (ulong)(lVar14 << 5)) / lVar13 <<
             2;
  }
  if (lVar14 < 5) {
    lVar14 = lVar13;
  }
  pdVar25 = _other + 1;
  local_f0 = _tri + 1;
  lVar20 = lVar2 * (triStride * 8 + 8);
  local_e0 = _tri + lVar2;
  local_d8 = _other + lVar2;
  local_d0 = size - lVar2;
  local_98 = 0;
  lVar12 = size;
  while( true ) {
    lVar7 = lVar12;
    if (lVar2 < lVar12) {
      lVar7 = lVar2;
    }
    depth = size - local_98;
    if (depth == 0 || size < local_98) break;
    if (lVar2 < depth) {
      depth = lVar2;
    }
    local_b8 = pdVar25;
    for (lVar11 = 0; lVar4 = otherSize - lVar11, lVar4 != 0 && lVar11 <= otherSize;
        lVar11 = lVar11 + lVar14) {
      if (lVar14 < lVar4) {
        lVar4 = lVar14;
      }
      lVar19 = 0;
      pdVar26 = local_f0;
      pdVar15 = local_b8;
      lVar17 = lVar7;
      while( true ) {
        lVar5 = lVar13;
        if (lVar17 < 4) {
          lVar5 = lVar17;
        }
        lVar6 = 0;
        if (0 < lVar5) {
          lVar6 = lVar5;
        }
        lVar21 = depth - lVar19;
        if (lVar21 == 0 || depth < lVar19) break;
        pdStack_40 = (double *)(local_98 + lVar19);
        lVar13 = 0;
        pdVar9 = pdVar26;
        pdVar10 = pdVar15;
        while( true ) {
          lVar5 = lVar5 + -1;
          lVar16 = 0;
          if (0 < lVar5) {
            lVar16 = lVar5;
          }
          pdVar18 = pdVar10;
          lVar22 = lVar11;
          if (lVar13 == lVar6) break;
          for (; lVar22 < lVar4 + lVar11; lVar22 = lVar22 + 1) {
            dVar1 = _other[local_98 + lVar19 + lVar22 * otherStride + lVar13];
            for (lVar23 = 0; lVar16 != lVar23; lVar23 = lVar23 + 1) {
              pdVar18[lVar23] = pdVar9[lVar23] * -dVar1 + pdVar18[lVar23];
            }
            pdVar18 = pdVar18 + otherStride;
          }
          lVar13 = lVar13 + 1;
          pdVar10 = pdVar10 + 1;
          pdVar9 = pdVar9 + triStride + 1;
        }
        pdVar8[-1] = 1.97626258336499e-323;
        lVar13 = (long)pdVar8[-1];
        if (lVar21 < 4) {
          lVar13 = lVar21;
        }
        local_60.m_data = _other + (long)(lVar11 * otherStride + (long)pdStack_40);
        local_60.m_stride = otherStride;
        pdVar8[-2] = (double)lVar19;
        pdVar8[-3] = 6.73491019850599e-318;
        gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
        ::operator()(&local_41,local_88 + lVar11 * depth,&local_60,lVar13,lVar4,depth,
                     (long)pdVar8[-2]);
        pLVar3 = local_50;
        lVar21 = lVar21 - lVar13;
        if (0 < lVar21) {
          pdVar9 = (double *)(lVar13 + (long)pdStack_40);
          lVar5 = (long)pdStack_40 * triStride;
          pdStack_40 = pdVar9;
          local_60.m_data = _tri + (long)(lVar5 + (long)pdVar9);
          local_60.m_stride = triStride;
          pdVar8[-2] = 0.0;
          pdVar8[-3] = 6.73543884874704e-318;
          gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
          ::operator()(local_31,pLVar3,(const_blas_data_mapper<double,_long,_0> *)&local_60,lVar13,
                       lVar21,0,(long)pdVar8[-2]);
          pLVar3 = local_50;
          local_60.m_data = _other + (long)(lVar11 * otherStride + (long)pdStack_40);
          local_60.m_stride = otherStride;
          pdVar8[-2] = (double)lVar19;
          pdVar8[-3] = 0.0;
          pdVar8[-4] = (double)depth;
          pdVar8[-5] = (double)lVar13;
          pdVar8[-6] = (double)lVar4;
          pdVar8[-7] = 6.73586868585893e-318;
          gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
          ::operator()(&local_32,&local_60,pLVar3,local_88 + lVar11 * depth,lVar21,lVar13,
                       (long)pdVar8[-6],-1.0,(long)pdVar8[-5],(long)pdVar8[-4],(long)pdVar8[-3],
                       (long)pdVar8[-2]);
        }
        lVar19 = lVar19 + 4;
        lVar17 = lVar17 + -4;
        pdVar15 = pdVar15 + 4;
        pdVar26 = pdVar26 + triStride * 4 + 4;
        pdVar8[-1] = 1.97626258336499e-323;
        lVar13 = (long)pdVar8[-1];
      }
      local_b8 = local_b8 + otherStride * lVar14;
    }
    local_98 = local_98 + lVar2;
    pdVar26 = local_d8;
    pdVar15 = local_e0;
    lVar11 = local_d0;
    for (lVar7 = local_98; pLVar3 = local_50, lVar7 < size; lVar7 = lVar7 + lVar24) {
      lVar4 = lVar11;
      if (lVar24 <= lVar11) {
        lVar4 = lVar24;
      }
      if (0 < lVar4) {
        pdStack_40 = pdVar26;
        local_60.m_data = pdVar15;
        local_60.m_stride = triStride;
        pdVar8[-2] = 0.0;
        pdVar8[-3] = 6.7371433752252e-318;
        gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
        ::operator()(local_31,pLVar3,(const_blas_data_mapper<double,_long,_0> *)&local_60,depth,
                     lVar4,0,(long)pdVar8[-2]);
        local_60.m_data = pdStack_40;
        local_60.m_stride = otherStride;
        pdVar8[-3] = 0.0;
        pdVar8[-2] = 0.0;
        pdVar8[-4] = -NAN;
        pdVar8[-5] = -NAN;
        pdVar8[-6] = (double)otherSize;
        pLVar3 = local_50;
        pdVar8[-7] = 6.7375583903677e-318;
        gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
        ::operator()(&local_32,&local_60,pLVar3,local_88,lVar4,depth,(long)pdVar8[-6],-1.0,
                     (long)pdVar8[-5],(long)pdVar8[-4],(long)pdVar8[-3],(long)pdVar8[-2]);
        pdVar8[-1] = 1.97626258336499e-323;
        lVar13 = (long)pdVar8[-1];
        pdVar26 = pdStack_40;
      }
      pdVar15 = pdVar15 + lVar24;
      pdVar26 = pdVar26 + lVar24;
      lVar11 = lVar11 - lVar24;
    }
    lVar12 = lVar12 - lVar2;
    pdVar25 = pdVar25 + lVar2;
    local_f0 = (double *)((long)local_f0 + lVar20);
    local_e0 = (double *)((long)local_e0 + lVar20);
    local_d8 = local_d8 + lVar2;
    local_d0 = local_d0 - lVar2;
  }
  pdVar8[-1] = 6.73834395474459e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockA_stack_memory_destructor.m_deallocate);
  pdVar8[-1] = 6.73840324262209e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&l3);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor,OtherInnerStride>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherIncr, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor, Unaligned, OtherInnerStride> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride, otherIncr);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r(i3);

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar& otherij = other(i,j);
                otherij *= a;
                Scalar b = otherij;
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                typename TriMapper::LinearMapper l = tri.getLinearMapper(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r(i3) -= b * conj(l(i3));
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }